

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_renderer_base.h
# Opt level: O0

void __thiscall
agg::
renderer_base<agg::pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>_>
::blend_solid_hspan(renderer_base<agg::pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>_>
                    *this,int x,int y,int len,color_type *c,cover_type *covers)

{
  int iVar1;
  int8u *local_30;
  cover_type *covers_local;
  color_type *c_local;
  int len_local;
  int y_local;
  int x_local;
  renderer_base<agg::pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>_>
  *this_local;
  
  iVar1 = ymax(this);
  if ((y <= iVar1) && (iVar1 = ymin(this), iVar1 <= y)) {
    iVar1 = xmin(this);
    local_30 = covers;
    c_local._4_4_ = len;
    len_local = x;
    if (x < iVar1) {
      iVar1 = xmin(this);
      c_local._4_4_ = len - (iVar1 - x);
      if ((int)c_local._4_4_ < 1) {
        return;
      }
      iVar1 = xmin(this);
      local_30 = covers + (iVar1 - x);
      len_local = xmin(this);
    }
    iVar1 = xmax(this);
    if (iVar1 < (int)(len_local + c_local._4_4_)) {
      iVar1 = xmax(this);
      c_local._4_4_ = (iVar1 - len_local) + 1;
      if ((int)c_local._4_4_ < 1) {
        return;
      }
    }
    pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>
    ::blend_solid_hspan(this->m_ren,len_local,y,c_local._4_4_,c,local_30);
  }
  return;
}

Assistant:

void blend_solid_hspan(int x, int y, int len, 
                               const color_type& c, 
                               const cover_type* covers)
        {
            if(y > ymax()) return;
            if(y < ymin()) return;

            if(x < xmin())
            {
                len -= xmin() - x;
                if(len <= 0) return;
                covers += xmin() - x;
                x = xmin();
            }
            if(x + len > xmax())
            {
                len = xmax() - x + 1;
                if(len <= 0) return;
            }
            m_ren->blend_solid_hspan(x, y, len, c, covers);
        }